

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack7_8(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  uVar1 = *(ulong *)in;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar2 = vpshufd_avx(auVar4,0x54);
  auVar4 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar4,_DAT_001a1e70);
  auVar4 = vpinsrd_avx(auVar2,(uint)(uVar1 >> 7) & 0x1ffffff,1);
  auVar4 = vpunpcklqdq_avx(auVar4,auVar3);
  auVar5._8_4_ = 0x7f;
  auVar5._0_8_ = 0x7f0000007f;
  auVar5._12_4_ = 0x7f;
  auVar4 = vpand_avx(auVar4,auVar5);
  *(undefined1 (*) [16])out = auVar4;
  auVar3 = vpsrlvd_avx2(auVar2,_DAT_001a1e80);
  auVar4 = vpinsrd_avx(auVar5,((uint)(uVar1 >> 0x20) & 7) << 4,0);
  auVar2 = vpor_avx(auVar3,auVar4);
  auVar4 = vpand_avx(auVar3,auVar5);
  auVar4 = vpblendd_avx2(auVar4,auVar2,1);
  *(undefined1 (*) [16])(out + 4) = auVar4;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack7_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 7);
  out++;
  *out = ((*in) >> 7) % (1U << 7);
  out++;
  *out = ((*in) >> 14) % (1U << 7);
  out++;
  *out = ((*in) >> 21) % (1U << 7);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 3)) << (7 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 7);
  out++;
  *out = ((*in) >> 10) % (1U << 7);
  out++;
  *out = ((*in) >> 17) % (1U << 7);
  out++;

  return in + 1;
}